

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlChar * xmlXPathCastBooleanToString(int val)

{
  xmlChar *local_18;
  xmlChar *ret;
  int val_local;
  
  if (val == 0) {
    local_18 = xmlStrdup((xmlChar *)"false");
  }
  else {
    local_18 = xmlStrdup((xmlChar *)"true");
  }
  return local_18;
}

Assistant:

xmlChar *
xmlXPathCastBooleanToString (int val) {
    xmlChar *ret;
    if (val)
	ret = xmlStrdup((const xmlChar *) "true");
    else
	ret = xmlStrdup((const xmlChar *) "false");
    return(ret);
}